

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpat.cpp
# Opt level: O1

void __thiscall
CVmObjPattern::load_from_image(CVmObjPattern *this,vm_obj_id_t self,char *ptr,size_t len)

{
  char *pcVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if ((this->super_CVmObject).ext_ == (char *)0x0) {
    iVar2 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])(G_mem_X->varheap_,0x18,this);
    (this->super_CVmObject).ext_ = (char *)CONCAT44(extraout_var,iVar2);
  }
  pcVar1 = (this->super_CVmObject).ext_;
  *(int *)(pcVar1 + 8) = (int)*ptr;
  vmb_get_dh_val(ptr,(vm_val_t *)(pcVar1 + 8));
  pcVar1 = (this->super_CVmObject).ext_;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  CVmObjTable::request_post_load_init(&G_obj_table_X,self);
  return;
}

Assistant:

void CVmObjPattern::load_from_image(VMG_ vm_obj_id_t self, const char *ptr,
                                    size_t len)
{
    /* if we don't already have an extension, allocate one */
    if (ext_ == 0)
        ext_ = (char *)G_mem->get_var_heap()
               ->alloc_mem(sizeof(vmobj_pat_ext), this);

    /* get our source value */
    vmb_get_dh(ptr, &get_ext()->str);

    /* 
     *   We haven't compiled our pattern yet.  Note that it might not be
     *   possible to obtain the text of our string at this point, because it
     *   might be another object and thus might not have been loaded yet.
     *   So, note that we have no pattern yet, and request post-load
     *   initialization, so that we can compile our pattern after we know all
     *   of the other objects have been loaded.  
     */
    set_pattern(0);
    G_obj_table->request_post_load_init(self);
}